

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_tests.cpp
# Opt level: O2

void __thiscall
syntax_tests::iu_PrintToTest_x_iutest_x_RawArray_Test::Body
          (iu_PrintToTest_x_iutest_x_RawArray_Test *this)

{
  uchar (*v) [3];
  uchar (*v_00) [3];
  char (*v_01) [3];
  char (*v_02) [3];
  uchar d [3];
  uchar c [3];
  uchar b [3];
  uchar a [3];
  undefined2 local_2dc;
  undefined1 local_2da;
  undefined2 local_2d8;
  undefined1 local_2d6;
  uchar local_2d4 [4];
  iuCodeMessage local_2d0;
  uchar local_29c [4];
  string local_298;
  string local_278;
  string local_258;
  string local_238;
  string local_218;
  string local_1f8;
  string local_1d8;
  string local_1b8;
  iuStreamMessage local_198;
  
  local_29c[2] = '\x02';
  local_29c[0] = '\0';
  local_29c[1] = '\x01';
  local_2d4[2] = '\x02';
  local_2d4[0] = '\0';
  local_2d4[1] = '\x01';
  local_2d6 = 2;
  local_2d8 = 0x100;
  local_2da = 2;
  local_2dc = 0x100;
  memset(&local_198,0,0x188);
  iutest::iu_global_format_stringstream::iu_global_format_stringstream(&local_198.m_stream);
  iutest::PrintToString<unsigned_char[3]>(&local_1b8,(uchar (*) [3])local_29c);
  iutest::detail::iuStreamMessage::operator<<(&local_198,&local_1b8);
  iutest::detail::iuCodeMessage::iuCodeMessage
            (&local_2d0,
             "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
             ,0x3eb,"Succeeded.\n");
  local_2d0._44_4_ = 0;
  iutest::AssertionHelper::operator=((AssertionHelper *)&local_2d0,(Fixed *)&local_198);
  std::__cxx11::string::~string((string *)&local_2d0);
  std::__cxx11::string::~string((string *)&local_1b8);
  iutest::iu_global_format_stringstream::~iu_global_format_stringstream(&local_198.m_stream);
  memset(&local_198,0,0x188);
  iutest::iu_global_format_stringstream::iu_global_format_stringstream(&local_198.m_stream);
  iutest::PrintToString<unsigned_char[3]>(&local_1d8,(uchar (*) [3])local_2d4);
  iutest::detail::iuStreamMessage::operator<<(&local_198,&local_1d8);
  iutest::detail::iuCodeMessage::iuCodeMessage
            (&local_2d0,
             "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
             ,0x3ec,"Succeeded.\n");
  local_2d0._44_4_ = 0;
  iutest::AssertionHelper::operator=((AssertionHelper *)&local_2d0,(Fixed *)&local_198);
  std::__cxx11::string::~string((string *)&local_2d0);
  std::__cxx11::string::~string((string *)&local_1d8);
  iutest::iu_global_format_stringstream::~iu_global_format_stringstream(&local_198.m_stream);
  memset(&local_198,0,0x188);
  iutest::iu_global_format_stringstream::iu_global_format_stringstream(&local_198.m_stream);
  iutest::PrintToString<unsigned_char_volatile[3]>(&local_1f8,(iutest *)&local_2d8,v);
  iutest::detail::iuStreamMessage::operator<<(&local_198,&local_1f8);
  iutest::detail::iuCodeMessage::iuCodeMessage
            (&local_2d0,
             "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
             ,0x3ed,"Succeeded.\n");
  local_2d0._44_4_ = 0;
  iutest::AssertionHelper::operator=((AssertionHelper *)&local_2d0,(Fixed *)&local_198);
  std::__cxx11::string::~string((string *)&local_2d0);
  std::__cxx11::string::~string((string *)&local_1f8);
  iutest::iu_global_format_stringstream::~iu_global_format_stringstream(&local_198.m_stream);
  memset(&local_198,0,0x188);
  iutest::iu_global_format_stringstream::iu_global_format_stringstream(&local_198.m_stream);
  iutest::PrintToString<unsigned_char_volatile[3]>(&local_218,(iutest *)&local_2dc,v_00);
  iutest::detail::iuStreamMessage::operator<<(&local_198,&local_218);
  iutest::detail::iuCodeMessage::iuCodeMessage
            (&local_2d0,
             "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
             ,0x3ee,"Succeeded.\n");
  local_2d0._44_4_ = 0;
  iutest::AssertionHelper::operator=((AssertionHelper *)&local_2d0,(Fixed *)&local_198);
  std::__cxx11::string::~string((string *)&local_2d0);
  std::__cxx11::string::~string((string *)&local_218);
  iutest::iu_global_format_stringstream::~iu_global_format_stringstream(&local_198.m_stream);
  local_29c[2] = '\x02';
  local_29c[0] = '\0';
  local_29c[1] = '\x01';
  local_2d4[2] = '\x02';
  local_2d4[0] = '\0';
  local_2d4[1] = '\x01';
  local_2d6 = 2;
  local_2d8 = 0x100;
  local_2da = 2;
  local_2dc = 0x100;
  memset(&local_198,0,0x188);
  iutest::iu_global_format_stringstream::iu_global_format_stringstream(&local_198.m_stream);
  iutest::PrintToString<char[3]>(&local_238,(char (*) [3])local_29c);
  iutest::detail::iuStreamMessage::operator<<(&local_198,&local_238);
  iutest::detail::iuCodeMessage::iuCodeMessage
            (&local_2d0,
             "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
             ,0x3f6,"Succeeded.\n");
  local_2d0._44_4_ = 0;
  iutest::AssertionHelper::operator=((AssertionHelper *)&local_2d0,(Fixed *)&local_198);
  std::__cxx11::string::~string((string *)&local_2d0);
  std::__cxx11::string::~string((string *)&local_238);
  iutest::iu_global_format_stringstream::~iu_global_format_stringstream(&local_198.m_stream);
  memset(&local_198,0,0x188);
  iutest::iu_global_format_stringstream::iu_global_format_stringstream(&local_198.m_stream);
  iutest::PrintToString<char[3]>(&local_258,(char (*) [3])local_2d4);
  iutest::detail::iuStreamMessage::operator<<(&local_198,&local_258);
  iutest::detail::iuCodeMessage::iuCodeMessage
            (&local_2d0,
             "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
             ,0x3f7,"Succeeded.\n");
  local_2d0._44_4_ = 0;
  iutest::AssertionHelper::operator=((AssertionHelper *)&local_2d0,(Fixed *)&local_198);
  std::__cxx11::string::~string((string *)&local_2d0);
  std::__cxx11::string::~string((string *)&local_258);
  iutest::iu_global_format_stringstream::~iu_global_format_stringstream(&local_198.m_stream);
  memset(&local_198,0,0x188);
  iutest::iu_global_format_stringstream::iu_global_format_stringstream(&local_198.m_stream);
  iutest::PrintToString<char_volatile[3]>(&local_278,(iutest *)&local_2d8,v_01);
  iutest::detail::iuStreamMessage::operator<<(&local_198,&local_278);
  iutest::detail::iuCodeMessage::iuCodeMessage
            (&local_2d0,
             "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
             ,0x3f8,"Succeeded.\n");
  local_2d0._44_4_ = 0;
  iutest::AssertionHelper::operator=((AssertionHelper *)&local_2d0,(Fixed *)&local_198);
  std::__cxx11::string::~string((string *)&local_2d0);
  std::__cxx11::string::~string((string *)&local_278);
  iutest::iu_global_format_stringstream::~iu_global_format_stringstream(&local_198.m_stream);
  memset(&local_198,0,0x188);
  iutest::iu_global_format_stringstream::iu_global_format_stringstream(&local_198.m_stream);
  iutest::PrintToString<char_volatile[3]>(&local_298,(iutest *)&local_2dc,v_02);
  iutest::detail::iuStreamMessage::operator<<(&local_198,&local_298);
  iutest::detail::iuCodeMessage::iuCodeMessage
            (&local_2d0,
             "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
             ,0x3f9,"Succeeded.\n");
  local_2d0._44_4_ = 0;
  iutest::AssertionHelper::operator=((AssertionHelper *)&local_2d0,(Fixed *)&local_198);
  std::__cxx11::string::~string((string *)&local_2d0);
  std::__cxx11::string::~string((string *)&local_298);
  iutest::iu_global_format_stringstream::~iu_global_format_stringstream(&local_198.m_stream);
  return;
}

Assistant:

IUTEST(PrintToTest, RawArray)
{
    {
        unsigned char a[3] = {0, 1, 2};
        const unsigned char b[3] = {0, 1, 2};
        const volatile unsigned char c[3] = {0, 1, 2};
        volatile unsigned char d[3] = {0, 1, 2};

        IUTEST_SUCCEED() << ::iutest::PrintToString(a);
        IUTEST_SUCCEED() << ::iutest::PrintToString(b);
        IUTEST_SUCCEED() << ::iutest::PrintToString(c);
        IUTEST_SUCCEED() << ::iutest::PrintToString(d);
    }
    {
        char a[3] = {0, 1, 2};
        const char b[3] = {0, 1, 2};
        const volatile char c[3] = {0, 1, 2};
        volatile char d[3] = {0, 1, 2};

        IUTEST_SUCCEED() << ::iutest::PrintToString(a);
        IUTEST_SUCCEED() << ::iutest::PrintToString(b);
        IUTEST_SUCCEED() << ::iutest::PrintToString(c);
        IUTEST_SUCCEED() << ::iutest::PrintToString(d);
    }
}